

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Vector<flatbuffers::Offset64<void>,unsigned_int>,unsigned_int>
          (JsonPrinter *this,Vector<flatbuffers::Offset64<void>,_unsigned_int> *param_2,uint param_3
          ,Type *param_4,int param_5,uint8_t *param_6)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint8_t *local_80;
  char *err;
  void *ptr;
  uint i;
  int elem_indent;
  bool is_struct;
  uint8_t *prev_val_local;
  int indent_local;
  Type *type_local;
  uint size_local;
  Vector<flatbuffers::Offset64<void>,_unsigned_int> *c_local;
  JsonPrinter *this_local;
  
  bVar1 = IsStruct(param_4);
  iVar2 = Indent(this);
  std::__cxx11::string::operator+=((string *)this->text,'[');
  AddNewLine(this);
  ptr._4_4_ = 0;
  while( true ) {
    if (param_3 <= ptr._4_4_) {
      AddNewLine(this);
      AddIndent(this,param_5);
      std::__cxx11::string::operator+=((string *)this->text,']');
      return (char *)0x0;
    }
    if (ptr._4_4_ != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,param_5 + iVar2);
    if (bVar1) {
      local_80 = Vector<flatbuffers::Offset64<void>,_unsigned_int>::Data(param_2);
      local_80 = local_80 + param_4->struct_def->bytesize * (ulong)ptr._4_4_;
    }
    else {
      local_80 = (uint8_t *)
                 Vector<flatbuffers::Offset64<void>,_unsigned_int>::operator[](param_2,ptr._4_4_);
    }
    pcVar3 = PrintOffset(this,local_80,param_4,param_5 + iVar2,param_6,ptr._4_4_);
    if (pcVar3 != (char *)0x0) break;
    ptr._4_4_ = ptr._4_4_ + 1;
  }
  return pcVar3;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }